

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  RtreeNode *pNode_00;
  uint uVar4;
  long in_FS_OFFSET;
  int iCell;
  RtreeCell cell;
  int local_6c;
  RtreeCell local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  do {
    pNode_00 = pNode->pParent;
    if (pNode_00 == (RtreeNode *)0x0) {
      iVar2 = 0;
      goto LAB_001fd2bf;
    }
    local_68.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
    local_68.aCoord[4].i = -1;
    local_68.aCoord[5].i = -1;
    local_68.aCoord[6].i = -1;
    local_68.aCoord[7].i = -1;
    local_68.aCoord[0].i = -1;
    local_68.aCoord[1].i = -1;
    local_68.aCoord[2].i = -1;
    local_68.aCoord[3].i = -1;
    local_68.aCoord[8] = (RtreeCoord)0xffffffff;
    local_68.aCoord[9] = (RtreeCoord)0xffffffff;
    local_6c = -0x55555556;
    if (uVar4 < 100) {
      if (pNode->pParent == (RtreeNode *)0x0) {
        local_6c = -1;
      }
      else {
        iVar2 = nodeRowidIndex(pRtree,pNode->pParent,pNode->iNode,&local_6c);
        if (iVar2 != 0) {
          bVar1 = false;
          pNode_00 = pNode;
          goto LAB_001fd2aa;
        }
      }
      iVar2 = local_6c;
      nodeGetCell(pRtree,pNode_00,local_6c,&local_68);
      iVar3 = cellContains(pRtree,&local_68,pCell);
      bVar1 = true;
      if (iVar3 == 0) {
        cellUnion(pRtree,&local_68,pCell);
        nodeOverwriteCell(pRtree,pNode_00,&local_68,iVar2);
      }
    }
    else {
      bVar1 = false;
      pNode_00 = pNode;
    }
LAB_001fd2aa:
    uVar4 = uVar4 + 1;
    pNode = pNode_00;
  } while (bVar1);
  iVar2 = 0x10b;
LAB_001fd2bf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  int cnt = 0;
  int rc;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    cnt++;
    if( NEVER(cnt>100) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }
    rc = nodeParentIndex(pRtree, p, &iCell);
    if( NEVER(rc!=SQLITE_OK) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }

    p = pParent;
  }
  return SQLITE_OK;
}